

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

Image * __thiscall
pbrt::Image::FloatResizeUp
          (Image *__return_storage_ptr__,Image *this,Point2i newRes,WrapMode2D wrapMode)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_t sVar2;
  Allocator alloc;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  char *args;
  char *args_1;
  uint newRes_00;
  uint newRes_01;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_> xWeights;
  vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_> yWeights;
  WrapMode2D wrapMode_local;
  _Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_> local_70;
  _Any_data local_58;
  code *pcStack_48;
  code *pcStack_40;
  ColorEncodingHandle local_38;
  
  newRes_01 = newRes.super_Tuple2<pbrt::Point2,_int>.x;
  xWeights.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(xWeights.
                         super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,newRes_01);
  iVar4 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  yWeights.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(yWeights.
                         super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar4);
  wrapMode_local = wrapMode;
  if ((int)newRes_01 < iVar4) {
    args_1 = "resolution.x";
    args = "newRes.x";
    iVar4 = 0x10b;
  }
  else {
    newRes_00 = newRes.super_Tuple2<pbrt::Point2,_int>.y;
    xWeights.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)CONCAT44(xWeights.
                           super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,newRes_00);
    iVar4 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
    yWeights.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)CONCAT44(yWeights.
                           super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar4);
    if (iVar4 <= (int)newRes_00) {
      pbVar1 = (this->channelNames).ptr;
      sVar2 = (this->channelNames).nStored;
      local_38.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )0;
      alloc.memoryResource = pstd::pmr::new_delete_resource();
      channels.n = sVar2;
      channels.ptr = pbVar1;
      Image(__return_storage_ptr__,Float,newRes,channels,&local_38,alloc);
      xWeights.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      yWeights.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      xWeights.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      xWeights.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      yWeights.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      yWeights.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ResampleWeights((vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_> *)
                      &local_70,(this->resolution).super_Tuple2<pbrt::Point2,_int>.x,newRes_01);
      std::vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>::_M_move_assign
                (&xWeights,&local_70);
      std::_Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>::~_Vector_base
                (&local_70);
      ResampleWeights((vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_> *)
                      &local_70,(this->resolution).super_Tuple2<pbrt::Point2,_int>.y,newRes_00);
      std::vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>::_M_move_assign
                (&yWeights,&local_70);
      std::_Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>::~_Vector_base
                (&local_70);
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      pcStack_48 = (code *)0x0;
      pcStack_40 = (code *)0x0;
      local_70._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44((int)newRes_00 >> 0x1f & newRes_00,(int)newRes_01 >> 0x1f & newRes_01);
      uVar3 = 0;
      uVar5 = 0;
      if (0 < (int)newRes_01) {
        uVar5 = (ulong)newRes.super_Tuple2<pbrt::Point2,_int> & 0xffffffff;
      }
      if (newRes_00 != 0 && -1 < (long)newRes.super_Tuple2<pbrt::Point2,_int>) {
        uVar3 = (ulong)newRes_00;
      }
      local_70._M_impl.super__Vector_impl_data._M_finish = (pointer)(uVar5 | uVar3 << 0x20);
      local_58._M_unused._M_object = operator_new(0x28);
      *(vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_> **)
       local_58._M_unused._0_8_ = &xWeights;
      *(vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_> **)
       ((long)local_58._M_unused._0_8_ + 8) = &yWeights;
      *(Image **)((long)local_58._M_unused._0_8_ + 0x10) = this;
      pcStack_40 = std::
                   _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp:276:45)>
                   ::_M_invoke;
      *(WrapMode2D **)((long)local_58._M_unused._0_8_ + 0x18) = &wrapMode_local;
      pcStack_48 = std::
                   _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp:276:45)>
                   ::_M_manager;
      *(Image **)((long)local_58._M_unused._0_8_ + 0x20) = __return_storage_ptr__;
      ParallelFor2D((pbrt *)&local_70,(Bounds2i *)&local_58,
                    (function<void_(pbrt::Bounds2<int>)> *)
                    std::
                    _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp:276:45)>
                    ::_M_invoke);
      std::_Function_base::~_Function_base((_Function_base *)&local_58);
      std::_Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>::~_Vector_base
                (&yWeights.
                  super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>);
      std::_Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>::~_Vector_base
                (&xWeights.
                  super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>);
      return __return_storage_ptr__;
    }
    args_1 = "resolution.y";
    args = "newRes.y";
    iVar4 = 0x10c;
  }
  LogFatal<char_const(&)[9],char_const(&)[13],char_const(&)[9],int&,char_const(&)[13],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
             ,iVar4,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [9])args,
             (char (*) [13])args_1,(char (*) [9])args,(int *)&xWeights,(char (*) [13])args_1,
             (int *)&yWeights);
}

Assistant:

Image Image::FloatResizeUp(Point2i newRes, WrapMode2D wrapMode) const {
    CHECK_GE(newRes.x, resolution.x);
    CHECK_GE(newRes.y, resolution.y);
    Image resampledImage(PixelFormat::Float, newRes, channelNames);
    // Compute $x$ and $y$ resampling weights for image resizing
    std::vector<ResampleWeight> xWeights, yWeights;
    xWeights = ResampleWeights(resolution[0], newRes[0]);
    yWeights = ResampleWeights(resolution[1], newRes[1]);

    // Resize image in parallel, working by tiles
    ParallelFor2D(Bounds2i({0, 0}, newRes), [&](Bounds2i outExtent) {
        // Determine extent in source image and copy pixel values to _inBuf_
        Bounds2i inExtent(Point2i(xWeights[outExtent.pMin.x].firstPixel,
                                  yWeights[outExtent.pMin.y].firstPixel),
                          Point2i(xWeights[outExtent.pMax.x - 1].firstPixel + 4,
                                  yWeights[outExtent.pMax.y - 1].firstPixel + 4));
        std::vector<float> inBuf(NChannels() * inExtent.Area());
        CopyRectOut(inExtent, pstd::span<float>(inBuf), wrapMode);

        // Resize image in the $x$ dimension
        // Compute image extents and allocate _xBuf_
        int nxOut = outExtent.pMax.x - outExtent.pMin.x;
        int nyOut = outExtent.pMax.y - outExtent.pMin.y;
        int nxIn = inExtent.pMax.x - inExtent.pMin.x;
        int nyIn = inExtent.pMax.y - inExtent.pMin.y;
        std::vector<float> xBuf(NChannels() * nyIn * nxOut);

        int xBufOffset = 0;
        for (int yOut = inExtent.pMin.y; yOut < inExtent.pMax.y; ++yOut) {
            for (int xOut = outExtent.pMin.x; xOut < outExtent.pMax.x; ++xOut) {
                // Resample image pixel _(xOut, yOut)_
                DCHECK(xOut >= 0 && xOut < xWeights.size());
                const ResampleWeight &rsw = xWeights[xOut];
                // Compute _inOffset_ into _inBuf_ for _(xOut, yOut)_
                // w.r.t. inBuf
                int xIn = rsw.firstPixel - inExtent.pMin.x;
                DCHECK_GE(xIn, 0);
                DCHECK_LT(xIn + 3, nxIn);
                int yIn = yOut - inExtent.pMin.y;
                int inOffset = NChannels() * (xIn + yIn * nxIn);
                DCHECK_GE(inOffset, 0);
                DCHECK_LT(inOffset + 3 * NChannels(), inBuf.size());

                for (int c = 0; c < NChannels(); ++c, ++xBufOffset, ++inOffset)
                    xBuf[xBufOffset] = rsw.weight[0] * inBuf[inOffset] +
                                       rsw.weight[1] * inBuf[inOffset + NChannels()] +
                                       rsw.weight[2] * inBuf[inOffset + 2 * NChannels()] +
                                       rsw.weight[3] * inBuf[inOffset + 3 * NChannels()];
            }
        }

        // Resize image in the $y$ dimension
        std::vector<float> outBuf(NChannels() * nxOut * nyOut);
        for (int x = 0; x < nxOut; ++x) {
            for (int y = 0; y < nyOut; ++y) {
                int yOut = y + outExtent[0][1];
                DCHECK(yOut >= 0 && yOut < yWeights.size());
                const ResampleWeight &rsw = yWeights[yOut];

                DCHECK_GE(rsw.firstPixel - inExtent[0][1], 0);
                int xBufOffset =
                    NChannels() * (x + nxOut * (rsw.firstPixel - inExtent[0][1]));
                DCHECK_GE(xBufOffset, 0);
                int step = NChannels() * nxOut;
                DCHECK_LT(xBufOffset + 3 * step, xBuf.size());

                int outOffset = NChannels() * (x + y * nxOut);
                for (int c = 0; c < NChannels(); ++c, ++outOffset, ++xBufOffset)
                    outBuf[outOffset] =
                        std::max<Float>(0, (rsw.weight[0] * xBuf[xBufOffset] +
                                            rsw.weight[1] * xBuf[xBufOffset + step] +
                                            rsw.weight[2] * xBuf[xBufOffset + 2 * step] +
                                            rsw.weight[3] * xBuf[xBufOffset + 3 * step]));
            }
        }

        // Copy resampled image pixels out into _resampledImage_
        resampledImage.CopyRectIn(outExtent, outBuf);
    });

    return resampledImage;
}